

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::FormatComment
          (string *__return_storage_ptr__,SourceLocationCommentPrinter *this,string *comment_text)

{
  ulong uVar1;
  size_type sVar2;
  SubstituteArg local_258;
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  SubstituteArg local_1c8;
  SubstituteArg local_198;
  SubstituteArg local_168;
  SubstituteArg local_138;
  SubstituteArg local_108;
  SubstituteArg local_d8;
  SubstituteArg local_a8;
  string *local_78;
  string *line;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_40 [8];
  string stripped_comment;
  string *comment_text_local;
  SourceLocationCommentPrinter *this_local;
  string *output;
  
  stripped_comment.field_2._8_8_ = comment_text;
  std::__cxx11::string::string((string *)local_40,(string *)comment_text);
  StripWhitespace((string *)local_40);
  Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&i,(string *)local_40,"\n",true);
  line._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (line._0_4_ = 0; uVar1 = (ulong)(int)line,
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i), uVar1 < sVar2; line._0_4_ = (int)line + 1) {
    local_78 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)line);
    strings::internal::SubstituteArg::SubstituteArg(&local_a8,&this->prefix_);
    strings::internal::SubstituteArg::SubstituteArg(&local_d8,local_78);
    strings::internal::SubstituteArg::SubstituteArg(&local_108);
    strings::internal::SubstituteArg::SubstituteArg(&local_138);
    strings::internal::SubstituteArg::SubstituteArg(&local_168);
    strings::internal::SubstituteArg::SubstituteArg(&local_198);
    strings::internal::SubstituteArg::SubstituteArg(&local_1c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_228);
    strings::internal::SubstituteArg::SubstituteArg(&local_258);
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"$0// $1\n",&local_a8,&local_d8,&local_108,&local_138,
               &local_168,&local_198,&local_1c8,&local_1f8,&local_228,&local_258);
  }
  line._7_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string FormatComment(const string& comment_text) {
    string stripped_comment = comment_text;
    StripWhitespace(&stripped_comment);
    std::vector<string> lines = Split(stripped_comment, "\n");
    string output;
    for (int i = 0; i < lines.size(); ++i) {
      const string& line = lines[i];
      strings::SubstituteAndAppend(&output, "$0// $1\n", prefix_, line);
    }
    return output;
  }